

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_key_agreement_raw_internal
          (psa_algorithm_t alg,psa_key_slot_t *private_key,uint8_t *peer_key,size_t peer_key_length,
          uint8_t *shared_secret,size_t shared_secret_size,size_t *shared_secret_length)

{
  mbedtls_ecp_keypair *pmVar1;
  psa_ecc_curve_t curve;
  psa_status_t pVar2;
  int iVar3;
  mbedtls_ecp_keypair *their_key;
  mbedtls_ecdh_context ecdh;
  mbedtls_ecp_keypair *local_2a8;
  size_t local_2a0;
  mbedtls_ecdh_context local_298;
  
  pVar2 = -0x86;
  if ((alg == 0x30200000) && (pVar2 = -0x87, *(char *)((long)&(private_key->attr).type + 1) == 'q'))
  {
    pmVar1 = (private_key->data).ecp;
    local_2a8 = (mbedtls_ecp_keypair *)0x0;
    local_2a0 = 0;
    curve = mbedtls_ecc_group_to_psa((pmVar1->grp).id,&local_2a0);
    mbedtls_ecdh_init(&local_298);
    pVar2 = psa_import_ec_public_key(curve,peer_key,peer_key_length,&local_2a8);
    if (pVar2 == 0) {
      iVar3 = mbedtls_ecdh_get_params(&local_298,local_2a8,MBEDTLS_ECDH_THEIRS);
      pVar2 = mbedtls_to_psa_error(iVar3);
      if (pVar2 == 0) {
        iVar3 = mbedtls_ecdh_get_params(&local_298,pmVar1,MBEDTLS_ECDH_OURS);
        pVar2 = mbedtls_to_psa_error(iVar3);
        if (pVar2 == 0) {
          iVar3 = mbedtls_ecdh_calc_secret
                            (&local_298,shared_secret_length,shared_secret,shared_secret_size,
                             mbedtls_ctr_drbg_random,&global_data.ctr_drbg);
          pVar2 = mbedtls_to_psa_error(iVar3);
          if ((pVar2 == 0) && (pVar2 = -0x97, local_2a0 + 7 >> 3 == *shared_secret_length)) {
            pVar2 = 0;
          }
        }
      }
    }
    if (pVar2 != 0) {
      mbedtls_platform_zeroize(shared_secret,shared_secret_size);
    }
    mbedtls_ecdh_free(&local_298);
    pmVar1 = local_2a8;
    mbedtls_ecp_keypair_free(local_2a8);
    free(pmVar1);
  }
  return pVar2;
}

Assistant:

static psa_status_t psa_key_agreement_raw_internal( psa_algorithm_t alg,
                                                    psa_key_slot_t *private_key,
                                                    const uint8_t *peer_key,
                                                    size_t peer_key_length,
                                                    uint8_t *shared_secret,
                                                    size_t shared_secret_size,
                                                    size_t *shared_secret_length )
{
    switch( alg )
    {
#if defined(MBEDTLS_ECDH_C)
        case PSA_ALG_ECDH:
            if( ! PSA_KEY_TYPE_IS_ECC_KEY_PAIR( private_key->attr.type ) )
                return( PSA_ERROR_INVALID_ARGUMENT );
            return( psa_key_agreement_ecdh( peer_key, peer_key_length,
                                            private_key->data.ecp,
                                            shared_secret, shared_secret_size,
                                            shared_secret_length ) );
#endif /* MBEDTLS_ECDH_C */
        default:
            (void) private_key;
            (void) peer_key;
            (void) peer_key_length;
            (void) shared_secret;
            (void) shared_secret_size;
            (void) shared_secret_length;
            return( PSA_ERROR_NOT_SUPPORTED );
    }
}